

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_util.cpp
# Opt level: O3

vector<unsigned_char,_std::allocator<unsigned_char>_> *
cfd::core::RandomNumberUtil::GetRandomBytes
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,int len)

{
  uint uVar1;
  undefined8 in_RAX;
  result_type_conflict rVar2;
  size_t __i;
  long lVar3;
  int iVar4;
  ulong uVar5;
  uint32_t random;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  if (GetRandomBytes(int)::rd == '\0') {
    iVar4 = __cxa_guard_acquire(&GetRandomBytes(int)::rd);
    if (iVar4 != 0) {
      std::random_device::random_device(&GetRandomBytes::rd);
      __cxa_atexit(std::random_device::~random_device,&GetRandomBytes::rd,&__dso_handle);
      __cxa_guard_release(&GetRandomBytes(int)::rd);
    }
  }
  if (GetRandomBytes(int)::engine == '\0') {
    iVar4 = __cxa_guard_acquire(&GetRandomBytes(int)::engine);
    if (iVar4 != 0) {
      uVar1 = ::std::random_device::_M_getval();
      uVar5 = (ulong)uVar1;
      lVar3 = 1;
      GetRandomBytes::engine._M_x[0] = uVar5;
      do {
        uVar5 = (ulong)(((uint)(uVar5 >> 0x1e) ^ (uint)uVar5) * 0x6c078965 + (int)lVar3);
        GetRandomBytes::engine._M_x[lVar3] = uVar5;
        lVar3 = lVar3 + 1;
      } while (lVar3 != 0x270);
      GetRandomBytes::engine._M_p = 0x270;
      __cxa_guard_release(&GetRandomBytes(int)::engine);
    }
  }
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (__return_storage_ptr__,(long)len,(allocator_type *)((long)&uStack_38 + 3));
  iVar4 = len + 3;
  if (-1 < len) {
    iVar4 = len;
  }
  if (len < 4) {
    uVar5 = 0;
  }
  else {
    iVar4 = iVar4 >> 2;
    uVar5 = 0;
    do {
      rVar2 = std::
              mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              ::operator()(&GetRandomBytes::engine);
      *(int *)((__return_storage_ptr__->
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start + uVar5) = (int)rVar2;
      uVar5 = uVar5 + 4;
      iVar4 = iVar4 + -1;
    } while (iVar4 != 0);
    uVar5 = uVar5 & 0xffffffff;
  }
  if (len % 4 != 0) {
    rVar2 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(&GetRandomBytes::engine);
    uStack_38 = CONCAT44((int)rVar2,(undefined4)uStack_38);
    memcpy((__return_storage_ptr__->
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start + uVar5,(void *)((long)&uStack_38 + 4),(long)(len % 4));
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<uint8_t> RandomNumberUtil::GetRandomBytes(int len) {
#if defined(_WIN32) && defined(__GNUC__) && (__GNUC__ < 9)
  // for mingw gcc lower 9
  static std::mt19937 engine(static_cast<unsigned int>(time(nullptr)));
#else
  static std::random_device rd;
  static std::mt19937 engine(rd());
#endif
  std::vector<uint8_t> result(len);

  int index = 0;
  for (int i = 0; i < len / 4; i++) {
    uint32_t random = engine();
    memcpy(&result[index], reinterpret_cast<uint8_t *>(&random), 4);
    index += 4;
  }

  int remainder = len % 4;
  if (remainder != 0) {
    uint32_t random = engine();
    memcpy(&result[index], reinterpret_cast<uint8_t *>(&random), remainder);
  }

  return result;
}